

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jccolor.c
# Opt level: O0

void rgb_ycc_start(j_compress_ptr cinfo)

{
  long lVar1;
  long lVar2;
  long in_RDI;
  INT32 i;
  INT32 *rgb_ycc_tab;
  my_cconvert_ptr cconvert;
  undefined8 local_20;
  
  lVar1 = *(long *)(in_RDI + 0x218);
  lVar2 = (*(code *)**(undefined8 **)(in_RDI + 8))(in_RDI,1,0x4000);
  *(long *)(lVar1 + 0x10) = lVar2;
  for (local_20 = 0; local_20 < 0x100; local_20 = local_20 + 1) {
    *(long *)(lVar2 + local_20 * 8) = local_20 * 0x4c8b;
    *(long *)(lVar2 + 0x800 + local_20 * 8) = local_20 * 0x9646;
    *(long *)(lVar2 + 0x1000 + local_20 * 8) = local_20 * 0x1d2f + 0x8000;
    *(long *)(lVar2 + 0x1800 + local_20 * 8) = local_20 * -0x2b33;
    *(long *)(lVar2 + 0x2000 + local_20 * 8) = local_20 * -0x54cd;
    *(long *)(lVar2 + 0x2800 + local_20 * 8) = local_20 * 0x8000 + 0x807fff;
    *(long *)(lVar2 + 0x3000 + local_20 * 8) = local_20 * -0x6b2f;
    *(long *)(lVar2 + 0x3800 + local_20 * 8) = local_20 * -0x14d1;
  }
  return;
}

Assistant:

METHODDEF(void)
rgb_ycc_start (j_compress_ptr cinfo)
{
  my_cconvert_ptr cconvert = (my_cconvert_ptr) cinfo->cconvert;
  INT32 * rgb_ycc_tab;
  INT32 i;

  /* Allocate and fill in the conversion tables. */
  cconvert->rgb_ycc_tab = rgb_ycc_tab = (INT32 *)
    (*cinfo->mem->alloc_small) ((j_common_ptr) cinfo, JPOOL_IMAGE,
				(TABLE_SIZE * SIZEOF(INT32)));

  for (i = 0; i <= MAXJSAMPLE; i++) {
    rgb_ycc_tab[i+R_Y_OFF] = FIX(0.29900) * i;
    rgb_ycc_tab[i+G_Y_OFF] = FIX(0.58700) * i;
    rgb_ycc_tab[i+B_Y_OFF] = FIX(0.11400) * i     + ONE_HALF;
    rgb_ycc_tab[i+R_CB_OFF] = (-FIX(0.16874)) * i;
    rgb_ycc_tab[i+G_CB_OFF] = (-FIX(0.33126)) * i;
    /* We use a rounding fudge-factor of 0.5-epsilon for Cb and Cr.
     * This ensures that the maximum output will round to MAXJSAMPLE
     * not MAXJSAMPLE+1, and thus that we don't have to range-limit.
     */
    rgb_ycc_tab[i+B_CB_OFF] = FIX(0.50000) * i    + CBCR_OFFSET + ONE_HALF-1;
/*  B=>Cb and R=>Cr tables are the same
    rgb_ycc_tab[i+R_CR_OFF] = FIX(0.50000) * i    + CBCR_OFFSET + ONE_HALF-1;
*/
    rgb_ycc_tab[i+G_CR_OFF] = (-FIX(0.41869)) * i;
    rgb_ycc_tab[i+B_CR_OFF] = (-FIX(0.08131)) * i;
  }
}